

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall
PreciseMeasurement_comparison_Test::TestBody(PreciseMeasurement_comparison_Test *this)

{
  double dVar1;
  bool bVar2;
  char *in_R9;
  AssertHelper local_70;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  precise_measurement local_38;
  
  local_58._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x408f400000000000;
  local_58._8_8_ = 0x3ff0000000000000;
  aStack_48._M_allocated_capacity = 1;
  local_38.value_ = 1.0;
  local_38.units_.multiplier_ = (double)0x408f400000000000;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  local_68[0] = (internal)
                units::precise_measurement::operator==((precise_measurement *)local_58,&local_38);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_68[0]) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,local_68,
               (AssertionResult *)"1000.0 * precise::m == 1 * precise::km","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x254,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
    }
    if ((long *)local_38.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_38.value_ + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
  local_58._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x408f400000000000;
  local_58._8_8_ = 0x3ff0000000000000;
  aStack_48._M_allocated_capacity = 1;
  local_38.value_ = 1.0;
  local_38.units_.multiplier_ = (double)0x408f400000000000;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  bVar2 = units::precise_measurement::operator!=((precise_measurement *)local_58,&local_38);
  local_68[0] = (internal)!bVar2;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_68[0]) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,local_68,
               (AssertionResult *)"1000.0 * precise::m != 1 * precise::km","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x255,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
    }
    if ((long *)local_38.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_38.value_ + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
  local_58._0_8_ = &DAT_3ff0000000000000;
  local_58._8_8_ = 0x3f9a027525460aa6;
  aStack_48._M_allocated_capacity = 1;
  local_38.value_ = 2.0;
  local_38.units_.multiplier_ = (double)0x3f847ae147ae147b;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  dVar1 = units::precise_measurement::value_as(&local_38,(precise_unit *)(local_58 + 8));
  local_68[0] = (internal)(dVar1 < 1.0);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (1.0 <= dVar1) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,local_68,(AssertionResult *)"1 * precise::in > 2 * precise::cm",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,599,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
    }
    if ((long *)local_38.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_38.value_ + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
  local_58._0_8_ = &DAT_3ff0000000000000;
  local_58._8_8_ = 0x3f9a027525460aa6;
  aStack_48._M_allocated_capacity = 1;
  local_38.value_ = 2.0;
  local_38.units_.multiplier_ = (double)0x3f847ae147ae147b;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  dVar1 = units::precise_measurement::value_as(&local_38,(precise_unit *)(local_58 + 8));
  local_68[0] = (internal)(dVar1 <= 1.0);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (1.0 < dVar1) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,local_68,(AssertionResult *)"1 * precise::in < 2 * precise::cm",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,600,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
    }
    if ((long *)local_38.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_38.value_ + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
  local_58._0_8_ = &DAT_3ff0000000000000;
  local_58._8_8_ = 0x3f9a027525460aa6;
  aStack_48._M_allocated_capacity = 1;
  local_38.value_ = (double)&DAT_400451eb851eb852;
  local_38.units_.multiplier_ = (double)0x3f847ae147ae147b;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  local_68[0] = (internal)
                units::precise_measurement::operator==((precise_measurement *)local_58,&local_38);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_68[0]) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,local_68,
               (AssertionResult *)"(1 * precise::in) == (2.54 * precise::cm)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x259,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
    }
    if ((long *)local_38.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_38.value_ + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
  local_58._0_8_ = &DAT_3ff0000000000000;
  local_58._8_8_ = 0x3f9a027525460aa6;
  aStack_48._M_allocated_capacity = 1;
  local_38.value_ = (double)&DAT_400451eb851eb852;
  local_38.units_.multiplier_ = (double)0x3f847ae147ae147b;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  local_68[0] = (internal)
                units::precise_measurement::operator>=((precise_measurement *)local_58,&local_38);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_68[0]) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,local_68,
               (AssertionResult *)"(1 * precise::in) >= (2.54 * precise::cm)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x25b,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
    }
    if ((long *)local_38.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_38.value_ + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
  local_58._0_8_ = &DAT_3ff0000000000000;
  local_58._8_8_ = 0x3f9a027525460aa6;
  aStack_48._M_allocated_capacity = 1;
  local_38.value_ = (double)&DAT_400451eb851eb852;
  local_38.units_.multiplier_ = (double)0x3f847ae147ae147b;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  local_68[0] = (internal)
                units::precise_measurement::operator<=((precise_measurement *)local_58,&local_38);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_68[0]) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,local_68,
               (AssertionResult *)"(1 * precise::in) <= (2.54 * precise::cm)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x25c,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
    }
    if ((long *)local_38.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_38.value_ + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
  local_58._0_8_ = &DAT_3ff0000000000000;
  local_58._8_8_ = 0x3f9a027525460aa6;
  aStack_48._M_allocated_capacity = 1;
  local_38.value_ = (double)&DAT_400453f7ced91687;
  local_38.units_.multiplier_ = (double)0x3f847ae147ae147b;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  bVar2 = units::precise_measurement::operator>=((precise_measurement *)local_58,&local_38);
  local_68[0] = (internal)!bVar2;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_68[0]) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,local_68,
               (AssertionResult *)"(1 * precise::in) >= (2.541 * precise::cm)","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x25d,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
    }
    if ((long *)local_38.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_38.value_ + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
  local_58._0_8_ = &DAT_3ff0000000000000;
  local_58._8_8_ = 0x3f9a027525460aa6;
  aStack_48._M_allocated_capacity = 1;
  local_38.value_ = (double)&DAT_400451f0c34c1a8b;
  local_38.units_.multiplier_ = (double)0x3f847ae147ae147b;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  local_68[0] = (internal)
                units::precise_measurement::operator<=((precise_measurement *)local_58,&local_38);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_68[0]) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,local_68,
               (AssertionResult *)"(1 * precise::in) <= (2.54001 * precise::cm)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x25e,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
    }
    if ((long *)local_38.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_38.value_ + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
  local_58._0_8_ = &DAT_3ff0000000000000;
  local_58._8_8_ = 0x3f9a027525460aa6;
  aStack_48._M_allocated_capacity = 1;
  local_38.value_ = 2.0;
  local_38.units_.multiplier_ = (double)0x3f847ae147ae147b;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  bVar2 = units::precise_measurement::operator<=((precise_measurement *)local_58,&local_38);
  local_68[0] = (internal)!bVar2;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_68[0]) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,local_68,
               (AssertionResult *)"(1 * precise::in) <= (2.0 * precise::cm)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x25f,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
    }
    if ((long *)local_38.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_38.value_ + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
  return;
}

Assistant:

TEST(PreciseMeasurement, comparison)
{
    EXPECT_TRUE(1000.0 * precise::m == 1 * precise::km);
    EXPECT_FALSE(1000.0 * precise::m != 1 * precise::km);

    EXPECT_TRUE(1 * precise::in > 2 * precise::cm);
    EXPECT_FALSE(1 * precise::in < 2 * precise::cm);
    EXPECT_TRUE((1 * precise::in) == (2.54 * precise::cm));

    EXPECT_TRUE((1 * precise::in) >= (2.54 * precise::cm));
    EXPECT_TRUE((1 * precise::in) <= (2.54 * precise::cm));
    EXPECT_FALSE((1 * precise::in) >= (2.541 * precise::cm));
    EXPECT_TRUE((1 * precise::in) <= (2.54001 * precise::cm));
    EXPECT_FALSE((1 * precise::in) <= (2.0 * precise::cm));
}